

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderInvariance.cpp
# Opt level: O1

void __thiscall
glcts::TessellationShaderInvarianceBaseTest::initTest(TessellationShaderInvarianceBaseTest *this)

{
  pointer *pp_Var1;
  glGetUniformLocationFunc p_Var2;
  iterator __position;
  TessellationShaderInvarianceBaseTest *pTVar3;
  GLuint GVar4;
  int iVar5;
  GLenum GVar6;
  uint uVar7;
  GLenum GVar8;
  GLenum GVar9;
  undefined4 extraout_var;
  TessellationShaderUtils *this_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TestError *pTVar10;
  long lVar11;
  bool bVar12;
  bool bVar13;
  GLuint shader_id;
  _test_program program;
  GLint link_status;
  uint n_xfb_names;
  char **xfb_names;
  GLuint local_c0;
  uint local_bc;
  GLenum local_b8;
  GLenum local_b4;
  TessellationShaderInvarianceBaseTest *local_b0;
  _test_program local_a4;
  GLchar **local_98;
  GLuint local_8c;
  GLuint local_88;
  GLuint local_84;
  GLsizei local_80;
  undefined4 uStack_7c;
  long local_70 [2];
  GLchar **local_60;
  undefined8 local_58;
  GLchar local_50;
  undefined7 uStack_4f;
  uint local_3c;
  vector<glcts::TessellationShaderInvarianceBaseTest::_test_program,std::allocator<glcts::TessellationShaderInvarianceBaseTest::_test_program>>
  *local_38;
  Functions *gl;
  
  iVar5 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar5);
  (*gl->genVertexArrays)(1,&this->m_vao_id);
  GVar6 = (*gl->getError)();
  glu::checkError(GVar6,"Could not generate vertex array object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                  ,0x12d);
  (*gl->bindVertexArray)(this->m_vao_id);
  GVar6 = (*gl->getError)();
  glu::checkError(GVar6,"Error binding vertex array object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                  ,0x130);
  (*gl->genQueries)(1,&this->m_qo_tfpw_id);
  GVar6 = (*gl->getError)();
  glu::checkError(GVar6,"glGenQueries() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                  ,0x134);
  this_00 = (TessellationShaderUtils *)operator_new(0x20);
  TessellationShaderUtils::TessellationShaderUtils(this_00,gl,&this->super_TestCaseBase);
  this->m_utils_ptr = this_00;
  (*gl->genBuffers)(1,&this->m_bo_id);
  GVar6 = (*gl->getError)();
  glu::checkError(GVar6,"glGenBuffers() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                  ,0x13e);
  (*gl->bindBuffer)(0x8c8e,this->m_bo_id);
  GVar6 = (*gl->getError)();
  glu::checkError(GVar6,"glBindBuffer() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                  ,0x141);
  (*gl->bindBufferBase)(0x8c8e,0,this->m_bo_id);
  GVar6 = (*gl->getError)();
  glu::checkError(GVar6,"glBindBufferBase() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                  ,0x145);
  uVar7 = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[6])(this);
  local_38 = (vector<glcts::TessellationShaderInvarianceBaseTest::_test_program,std::allocator<glcts::TessellationShaderInvarianceBaseTest::_test_program>>
              *)&this->m_programs;
  std::
  vector<glcts::TessellationShaderInvarianceBaseTest::_test_program,_std::allocator<glcts::TessellationShaderInvarianceBaseTest::_test_program>_>
  ::reserve((vector<glcts::TessellationShaderInvarianceBaseTest::_test_program,_std::allocator<glcts::TessellationShaderInvarianceBaseTest::_test_program>_>
             *)local_38,(ulong)uVar7);
  if (uVar7 != 0) {
    local_b8 = (this->super_TestCaseBase).m_glExtTokens.TESS_CONTROL_SHADER;
    GVar6 = (this->super_TestCaseBase).m_glExtTokens.TESS_EVALUATION_SHADER;
    local_84 = 0;
    local_88 = 0;
    local_bc = 0;
    local_8c = 0;
    local_b4 = GVar6;
    local_b0 = this;
    local_3c = uVar7;
    do {
      local_a4.po_id = (*gl->createProgram)();
      GVar8 = (*gl->getError)();
      glu::checkError(GVar8,"glCreateProgram() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                      ,0x157);
      if (initTest()::shader_types == '\0') {
        initTest();
      }
      lVar11 = 0;
      do {
        local_60 = (GLchar **)&local_50;
        local_58 = 0;
        local_50 = '\0';
        local_98 = (GLchar **)0x0;
        local_c0 = 0;
        GVar8 = *(GLenum *)((long)initTest::shader_types + lVar11);
        if ((GVar8 != 0x8b30 && GVar8 != GVar6) && (GVar8 != 0x8b31 && GVar8 != local_b8)) {
          pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar10,"Unrecognized shader type",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                     ,0x170);
          __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        bVar12 = GVar8 == GVar6;
        bVar13 = local_bc == 0;
        if (bVar13 || bVar12) {
          local_c0 = (*gl->createShader)(GVar8);
          GVar9 = (*gl->getError)();
          glu::checkError(GVar9,"glCreateShader() call failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                          ,0x17f);
          if (GVar8 == 0x8b30) {
            (*(local_b0->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[8])
                      (&local_80,local_b0,(ulong)local_bc);
          }
          else if (GVar8 == local_b8) {
            (*(local_b0->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0xc])
                      (&local_80,local_b0,(ulong)local_bc);
          }
          else if (GVar8 == GVar6) {
            (*(local_b0->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0xd])
                      (&local_80,local_b0,(ulong)local_bc);
          }
          else {
            if (GVar8 != 0x8b31) {
              pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (pTVar10,"Unrecognized shader type",(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                         ,0x194);
              goto LAB_00d2ef01;
            }
            (*(local_b0->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0xe])
                      (&local_80,local_b0,(ulong)local_bc);
          }
          std::__cxx11::string::operator=((string *)&local_60,(string *)&local_80);
          if ((long *)CONCAT44(uStack_7c,local_80) != local_70) {
            operator_delete((long *)CONCAT44(uStack_7c,local_80),local_70[0] + 1);
          }
          GVar6 = local_b4;
          local_98 = local_60;
          TestCaseBase::shaderSourceSpecialized
                    (&local_b0->super_TestCaseBase,local_c0,1,(GLchar **)&local_98);
          GVar9 = (*gl->getError)();
          glu::checkError(GVar9,"glShaderSource() call failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                          ,0x19a);
          TessellationShaderUtils::compileShaders(local_b0->m_utils_ptr,1,&local_c0,true);
          if (GVar8 != GVar6) {
            if (GVar8 == 0x8b30) {
              local_84 = local_c0;
            }
            else if (GVar8 == local_b8) {
              local_88 = local_c0;
            }
            else {
              if (GVar8 != 0x8b31) {
                pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
                tcu::TestError::TestError
                          (pTVar10,"Unrecognized shader type",(char *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                           ,0x1b6);
LAB_00d2ef01:
                __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
              }
              local_8c = local_c0;
            }
          }
        }
        else {
          local_c0 = local_8c;
          if (GVar8 == local_b8) {
            local_c0 = local_88;
          }
          if (GVar8 == 0x8b30) {
            local_c0 = local_84;
          }
        }
        (*gl->attachShader)(local_a4.po_id,local_c0);
        GVar8 = (*gl->getError)();
        glu::checkError(GVar8,"glAttachShader() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                        ,0x1c6);
        if (bVar13 || bVar12) {
          (*gl->deleteShader)(local_c0);
          GVar8 = (*gl->getError)();
          glu::checkError(GVar8,"glDeleteShader() call failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                          ,0x1cc);
        }
        if (local_60 != (GLchar **)&local_50) {
          operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
        }
        pTVar3 = local_b0;
        lVar11 = lVar11 + 4;
      } while (lVar11 != 0x10);
      local_80 = 0;
      local_60 = (GLchar **)0x0;
      (*(local_b0->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0xf])
                (local_b0,(ulong)local_bc,&local_80,&local_60);
      (*gl->transformFeedbackVaryings)(local_a4.po_id,local_80,local_60,0x8c8c);
      GVar8 = (*gl->getError)();
      glu::checkError(GVar8,"glTransformFeedbackVaryings() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                      ,0x1d7);
      local_98 = (GLchar **)((ulong)local_98 & 0xffffffff00000000);
      (*gl->linkProgram)(local_a4.po_id);
      GVar8 = (*gl->getError)();
      glu::checkError(GVar8,"glLinkProgram() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                      ,0x1dd);
      (*gl->getProgramiv)(local_a4.po_id,0x8b82,(GLint *)&local_98);
      GVar8 = (*gl->getError)();
      glu::checkError(GVar8,"glGetProgramiv() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                      ,0x1e0);
      GVar4 = local_a4.po_id;
      if ((int)local_98 != 1) {
        pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar10,"Program linking failed",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                   ,0x1e4);
        __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      p_Var2 = gl->getUniformLocation;
      iVar5 = (*(pTVar3->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[9])
                        (pTVar3);
      local_a4.inner_tess_level_uniform_location =
           (*p_Var2)(GVar4,(GLchar *)CONCAT44(extraout_var_00,iVar5));
      GVar4 = local_a4.po_id;
      p_Var2 = gl->getUniformLocation;
      iVar5 = (*(pTVar3->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[10])
                        (pTVar3);
      local_a4.outer_tess_level_uniform_location =
           (*p_Var2)(GVar4,(GLchar *)CONCAT44(extraout_var_01,iVar5));
      GVar8 = (*gl->getError)();
      glu::checkError(GVar8,"glGetUniformLocation() call(s) failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                      ,0x1ed);
      __position._M_current =
           (pTVar3->m_programs).
           super__Vector_base<glcts::TessellationShaderInvarianceBaseTest::_test_program,_std::allocator<glcts::TessellationShaderInvarianceBaseTest::_test_program>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (pTVar3->m_programs).
          super__Vector_base<glcts::TessellationShaderInvarianceBaseTest::_test_program,_std::allocator<glcts::TessellationShaderInvarianceBaseTest::_test_program>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<glcts::TessellationShaderInvarianceBaseTest::_test_program,std::allocator<glcts::TessellationShaderInvarianceBaseTest::_test_program>>
        ::_M_realloc_insert<glcts::TessellationShaderInvarianceBaseTest::_test_program_const&>
                  (local_38,__position,&local_a4);
      }
      else {
        (__position._M_current)->outer_tess_level_uniform_location =
             local_a4.outer_tess_level_uniform_location;
        (__position._M_current)->po_id = local_a4.po_id;
        (__position._M_current)->inner_tess_level_uniform_location =
             local_a4.inner_tess_level_uniform_location;
        pp_Var1 = &(pTVar3->m_programs).
                   super__Vector_base<glcts::TessellationShaderInvarianceBaseTest::_test_program,_std::allocator<glcts::TessellationShaderInvarianceBaseTest::_test_program>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pp_Var1 = *pp_Var1 + 1;
      }
      local_bc = local_bc + 1;
    } while (local_bc != local_3c);
  }
  return;
}

Assistant:

void TessellationShaderInvarianceBaseTest::initTest()
{
	const glw::Functions& gl		   = m_context.getRenderContext().getFunctions();
	glw::GLuint			  shared_fs_id = 0;
	glw::GLuint			  shared_tc_id = 0;
	glw::GLuint			  shared_te_id = 0;
	glw::GLuint			  shared_vs_id = 0;

	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate vertex array object");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex array object!");

	/* Initialize GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN query object */
	gl.genQueries(1, &m_qo_tfpw_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenQueries() call failed");

	/* Initialize tessellation shader utils */
	m_utils_ptr = new TessellationShaderUtils(gl, this);

	/* Initialize a buffer object we will use to store XFB data.
	 * Note: we intentionally skip a glBufferData() call here,
	 *       the actual buffer storage size is iteration-specific.
	 **/
	gl.genBuffers(1, &m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call failed");

	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* index */
					  m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() call failed");

	/* Iterate through all iterations */
	const unsigned int n_iterations = getAmountOfIterations();
	m_programs.reserve(n_iterations);

	const glw::GLenum SHADER_TYPE_FRAGMENT				  = GL_FRAGMENT_SHADER;
	const glw::GLenum SHADER_TYPE_TESSELLATION_CONTROL	= m_glExtTokens.TESS_CONTROL_SHADER;
	const glw::GLenum SHADER_TYPE_TESSELLATION_EVALUATION = m_glExtTokens.TESS_EVALUATION_SHADER;
	const glw::GLenum SHADER_TYPE_VERTEX				  = GL_VERTEX_SHADER;

	for (unsigned int n_iteration = 0; n_iteration < n_iterations; ++n_iteration)
	{
		_test_program program;

		/* Create an iteration-specific program object */
		program.po_id = gl.createProgram();

		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed.");

		/* Query the implementation on which shader types should be compiled on
		 * a per-iteration basis, and which can be initialized only once */
		static const glw::GLenum shader_types[] = { SHADER_TYPE_FRAGMENT, SHADER_TYPE_TESSELLATION_CONTROL,
													SHADER_TYPE_TESSELLATION_EVALUATION, SHADER_TYPE_VERTEX };
		static const unsigned int n_shader_types = sizeof(shader_types) / sizeof(shader_types[0]);

		for (unsigned int n_shader_type = 0; n_shader_type < n_shader_types; ++n_shader_type)
		{
			std::string shader_body;
			const char* shader_body_ptr = DE_NULL;
			glw::GLuint shader_id		= 0;
			glw::GLenum shader_type		= shader_types[n_shader_type];
			glw::GLenum shader_type_es  = (glw::GLenum)shader_type;

			// Check whether the test should use a separate program objects for each iteration.
			bool is_shader_iteration_specific = false;
			if (shader_type == SHADER_TYPE_TESSELLATION_EVALUATION)
			{
				is_shader_iteration_specific = true;
			}
			else if ((shader_type != SHADER_TYPE_FRAGMENT) && (shader_type != SHADER_TYPE_TESSELLATION_CONTROL) &&
					 (shader_type != SHADER_TYPE_VERTEX))
			{
				TCU_FAIL("Unrecognized shader type");
			}

			/* We need to initialize the shader object if:
			 *
			 * - its body differs between iterations;
			 * - its body is shared by all iterations AND this is the first iteration
			 */
			bool has_shader_been_generated = false;

			if ((!is_shader_iteration_specific && n_iteration == 0) || is_shader_iteration_specific)
			{
				/* Create the shader object */
				has_shader_been_generated = true;
				shader_id				  = gl.createShader(shader_type_es);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed");

				/* Assign shader body to the object */
				if (shader_type == SHADER_TYPE_FRAGMENT)
				{
					shader_body = getFSCode(n_iteration);
				}
				else if (shader_type == SHADER_TYPE_TESSELLATION_CONTROL)
				{
					shader_body = getTCCode(n_iteration);
				}
				else if (shader_type == SHADER_TYPE_TESSELLATION_EVALUATION)
				{
					shader_body = getTECode(n_iteration);
				}
				else if (shader_type == SHADER_TYPE_VERTEX)
				{
					shader_body = getVSCode(n_iteration);
				}
				else
				{
					TCU_FAIL("Unrecognized shader type");
				}

				shader_body_ptr = shader_body.c_str();

				shaderSourceSpecialized(shader_id, 1, &shader_body_ptr);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed");

				/* Compile the shader object */
				m_utils_ptr->compileShaders(1,				   /* n_shaders */
											&shader_id, true); /* should_succeed */

				/* If this is a shader object that will be shared by all iterations, cache it
				 * in a dedicated variable */
				if (!is_shader_iteration_specific)
				{
					if (shader_type == SHADER_TYPE_FRAGMENT)
					{
						shared_fs_id = shader_id;
					}
					else if (shader_type == SHADER_TYPE_TESSELLATION_CONTROL)
					{
						shared_tc_id = shader_id;
					}
					else if (shader_type == SHADER_TYPE_TESSELLATION_EVALUATION)
					{
						shared_te_id = shader_id;
					}
					else if (shader_type == SHADER_TYPE_VERTEX)
					{
						shared_vs_id = shader_id;
					}
					else
					{
						TCU_FAIL("Unrecognized shader type");
					}
				} /* if (!is_shader_iteration_specific) */
			}	 /* if (shader object needs to be initialized) */
			else
			{
				shader_id = (shader_type == SHADER_TYPE_FRAGMENT) ?
								shared_fs_id :
								(shader_type == SHADER_TYPE_TESSELLATION_CONTROL) ?
								shared_tc_id :
								(shader_type == SHADER_TYPE_TESSELLATION_EVALUATION) ? shared_te_id : shared_vs_id;
			}

			/* Attach the shader object to iteration-specific program object */
			gl.attachShader(program.po_id, shader_id);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call failed.");

			/* Now that the object has been attached, we can flag it for deletion */
			if (has_shader_been_generated)
			{
				gl.deleteShader(shader_id);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteShader() call failed");
			}
		} /* for (all shader types) */

		/* Set up transform feed-back */
		unsigned int n_xfb_names = 0;
		const char** xfb_names   = NULL;

		getXFBProperties(n_iteration, &n_xfb_names, &xfb_names);

		gl.transformFeedbackVaryings(program.po_id, n_xfb_names, xfb_names, GL_INTERLEAVED_ATTRIBS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() call failed.");

		/* Try to link the program object */
		glw::GLint link_status = GL_FALSE;

		gl.linkProgram(program.po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call failed");

		gl.getProgramiv(program.po_id, GL_LINK_STATUS, &link_status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed");

		if (link_status != GL_TRUE)
		{
			TCU_FAIL("Program linking failed");
		}

		/* Retrieve inner/outer tess level uniform locations */
		program.inner_tess_level_uniform_location =
			gl.getUniformLocation(program.po_id, getInnerTessLevelUniformName());
		program.outer_tess_level_uniform_location =
			gl.getUniformLocation(program.po_id, getOuterTessLevelUniformName());

		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetUniformLocation() call(s) failed");

		/* Store the program object */
		m_programs.push_back(program);
	} /* for (all iterations) */
}